

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printConditional(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pRVar1 = Ref::operator[]((Ref *)&this_local,1);
  printChild(this,pRVar1->inst,(Ref)this_local,-1);
  space(this);
  emit(this,'?');
  space(this);
  pRVar1 = Ref::operator[]((Ref *)&this_local,2);
  printChild(this,pRVar1->inst,(Ref)this_local,0);
  space(this);
  emit(this,':');
  space(this);
  pRVar1 = Ref::operator[]((Ref *)&this_local,3);
  printChild(this,pRVar1->inst,(Ref)this_local,1);
  return;
}

Assistant:

void printConditional(Ref node) {
    printChild(node[1], node, -1);
    space();
    emit('?');
    space();
    printChild(node[2], node, 0);
    space();
    emit(':');
    space();
    printChild(node[3], node, 1);
  }